

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O1

Transform * __thiscall sf::Transform::getInverse(Transform *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Transform *in_RDI;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar1 = this->m_matrix[0];
  fVar2 = this->m_matrix[1];
  fVar3 = this->m_matrix[0xf];
  fVar4 = this->m_matrix[5];
  fVar5 = this->m_matrix[7];
  fVar6 = this->m_matrix[0xd];
  fVar10 = fVar3 * fVar4 - fVar6 * fVar5;
  fVar7 = this->m_matrix[4];
  fVar8 = this->m_matrix[0xc];
  fVar11 = fVar3 * fVar7 - fVar8 * fVar5;
  fVar9 = this->m_matrix[3];
  fVar12 = fVar6 * fVar7 - fVar8 * fVar4;
  fVar13 = fVar9 * fVar12 + (fVar1 * fVar10 - fVar11 * fVar2);
  if ((fVar13 == 0.0) && (!NAN(fVar13))) {
    in_RDI->m_matrix[0xc] = 0.0;
    in_RDI->m_matrix[0xd] = 0.0;
    in_RDI->m_matrix[0xe] = 0.0;
    in_RDI->m_matrix[0xf] = 1.0;
    in_RDI->m_matrix[8] = 0.0;
    in_RDI->m_matrix[9] = 0.0;
    in_RDI->m_matrix[10] = 1.0;
    in_RDI->m_matrix[0xb] = 0.0;
    in_RDI->m_matrix[4] = 0.0;
    in_RDI->m_matrix[5] = 1.0;
    in_RDI->m_matrix[6] = 0.0;
    in_RDI->m_matrix[7] = 0.0;
    in_RDI->m_matrix[0] = 1.0;
    in_RDI->m_matrix[1] = 0.0;
    in_RDI->m_matrix[2] = 0.0;
    in_RDI->m_matrix[3] = 0.0;
    return in_RDI;
  }
  in_RDI->m_matrix[0] = fVar10 / fVar13;
  in_RDI->m_matrix[4] = -fVar11 / fVar13;
  in_RDI->m_matrix[8] = 0.0;
  in_RDI->m_matrix[9] = 0.0;
  in_RDI->m_matrix[0xc] = fVar12 / fVar13;
  in_RDI->m_matrix[1] = -(fVar3 * fVar2 - fVar6 * fVar9) / fVar13;
  in_RDI->m_matrix[5] = (fVar3 * fVar1 - fVar8 * fVar9) / fVar13;
  in_RDI->m_matrix[0xd] = -(fVar6 * fVar1 + fVar8 * -fVar2) / fVar13;
  in_RDI->m_matrix[2] = 0.0;
  in_RDI->m_matrix[6] = 0.0;
  in_RDI->m_matrix[10] = 1.0;
  in_RDI->m_matrix[0xb] = 0.0;
  in_RDI->m_matrix[0xe] = 0.0;
  in_RDI->m_matrix[3] = (fVar2 * fVar5 - fVar4 * fVar9) / fVar13;
  in_RDI->m_matrix[7] = -(fVar5 * fVar1 - fVar9 * fVar7) / fVar13;
  in_RDI->m_matrix[0xf] = (fVar4 * fVar1 + fVar7 * -fVar2) / fVar13;
  return in_RDI;
}

Assistant:

Transform Transform::getInverse() const
{
    // Compute the determinant
    float det = m_matrix[0] * (m_matrix[15] * m_matrix[5] - m_matrix[7] * m_matrix[13]) -
                m_matrix[1] * (m_matrix[15] * m_matrix[4] - m_matrix[7] * m_matrix[12]) +
                m_matrix[3] * (m_matrix[13] * m_matrix[4] - m_matrix[5] * m_matrix[12]);

    // Compute the inverse if the determinant is not zero
    // (don't use an epsilon because the determinant may *really* be tiny)
    if (det != 0.f)
    {
        return Transform( (m_matrix[15] * m_matrix[5] - m_matrix[7] * m_matrix[13]) / det,
                         -(m_matrix[15] * m_matrix[4] - m_matrix[7] * m_matrix[12]) / det,
                          (m_matrix[13] * m_matrix[4] - m_matrix[5] * m_matrix[12]) / det,
                         -(m_matrix[15] * m_matrix[1] - m_matrix[3] * m_matrix[13]) / det,
                          (m_matrix[15] * m_matrix[0] - m_matrix[3] * m_matrix[12]) / det,
                         -(m_matrix[13] * m_matrix[0] - m_matrix[1] * m_matrix[12]) / det,
                          (m_matrix[7]  * m_matrix[1] - m_matrix[3] * m_matrix[5])  / det,
                         -(m_matrix[7]  * m_matrix[0] - m_matrix[3] * m_matrix[4])  / det,
                          (m_matrix[5]  * m_matrix[0] - m_matrix[1] * m_matrix[4])  / det);
    }
    else
    {
        return Identity;
    }
}